

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::PerfEvents_RawEvent::PerfEvents_RawEvent(PerfEvents_RawEvent *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__PerfEvents_RawEvent_003c7040
  ;
  this->type_ = 0;
  this->config_ = 0;
  this->config1_ = 0;
  this->config2_ = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

PerfEvents_RawEvent::PerfEvents_RawEvent() = default;